

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O3

void __thiscall BloatyTest::~BloatyTest(BloatyTest *this)

{
  RollupOutput *__ptr;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__BloatyTest_0061fdf8;
  __ptr = (this->output_)._M_t.
          super___uniq_ptr_impl<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_>.
          _M_t.
          super__Tuple_impl<0UL,_bloaty::RollupOutput_*,_std::default_delete<bloaty::RollupOutput>_>
          .super__Head_base<0UL,_bloaty::RollupOutput_*,_false>._M_head_impl;
  if (__ptr != (RollupOutput *)0x0) {
    std::default_delete<bloaty::RollupOutput>::operator()
              ((default_delete<bloaty::RollupOutput> *)&this->output_,__ptr);
  }
  (this->output_)._M_t.
  super___uniq_ptr_impl<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_>._M_t.
  super__Tuple_impl<0UL,_bloaty::RollupOutput_*,_std::default_delete<bloaty::RollupOutput>_>.
  super__Head_base<0UL,_bloaty::RollupOutput_*,_false>._M_head_impl = (RollupOutput *)0x0;
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

void CheckConsistencyForRow(const bloaty::RollupRow& row, bool is_toplevel,
                             bool diff_mode, int* count) {
    // If any children exist, they should sum up to this row's values.
    // Also none of the children should have the same name.
    std::unordered_set<std::string> names;

    if (row.sorted_children.size() > 0) {
      uint64_t vmtotal = 0;
      uint64_t filetotal = 0;
      for (const auto& child : row.sorted_children) {
        vmtotal += child.size.vm;
        filetotal += child.size.file;
        CheckConsistencyForRow(child, false, diff_mode, count);
        ASSERT_TRUE(names.insert(child.name).second);
        ASSERT_FALSE(child.size.vm == 0 && child.size.file == 0);
      }

      if (!diff_mode) {
        ASSERT_EQ(vmtotal, row.size.vm);
        ASSERT_EQ(filetotal, row.size.file);
      }
    } else {
      // Count leaf rows.
      *count += 1;
    }

    if (!is_toplevel && row.sorted_children.size() == 1) {
      ASSERT_NE(NONE_STRING, row.sorted_children[0].name);
    }
  }